

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

void __thiscall IR::LabelInstr::AddLabelRef(LabelInstr *this,BranchInstr *branchRef)

{
  RealCount *pRVar1;
  Type pSVar2;
  
  pSVar2 = (Type)new<Memory::ArenaAllocator>
                           (0x10,(this->labelRefs).
                                 super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                                 allocator,0x366bee);
  pSVar2[1].next = (Type)branchRef;
  pSVar2->next = (this->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                 .super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
  (this->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar2;
  pRVar1 = &(this->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
            super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  return;
}

Assistant:

void
LabelInstr::AddLabelRef(BranchInstr *branchRef)
{
    this->labelRefs.Prepend(branchRef);
}